

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_result_modifier.cpp
# Opt level: O2

unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true> __thiscall
duckdb::ResultModifier::Deserialize(ResultModifier *this,Deserializer *deserializer)

{
  ResultModifierType RVar1;
  SerializationException *this_00;
  allocator local_41;
  string local_40;
  
  RVar1 = Deserializer::ReadProperty<duckdb::ResultModifierType>(deserializer,100,"type");
  this->_vptr_ResultModifier = (_func_int **)0x0;
  switch(RVar1) {
  case LIMIT_MODIFIER:
    LimitModifier::Deserialize((LimitModifier *)&local_40,deserializer);
    break;
  case ORDER_MODIFIER:
    OrderModifier::Deserialize((OrderModifier *)&local_40,deserializer);
    break;
  case DISTINCT_MODIFIER:
    DistinctModifier::Deserialize((DistinctModifier *)&local_40,deserializer);
    break;
  case LIMIT_PERCENT_MODIFIER:
    LimitPercentModifier::Deserialize((LimitPercentModifier *)&local_40,deserializer);
    break;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,"Unsupported type for deserialization of ResultModifier!",
               &local_41);
    SerializationException::SerializationException(this_00,&local_40);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this->_vptr_ResultModifier = (_func_int **)local_40._M_dataplus._M_p;
  return (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>)
         (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>)this;
}

Assistant:

unique_ptr<ResultModifier> ResultModifier::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<ResultModifierType>(100, "type");
	unique_ptr<ResultModifier> result;
	switch (type) {
	case ResultModifierType::DISTINCT_MODIFIER:
		result = DistinctModifier::Deserialize(deserializer);
		break;
	case ResultModifierType::LIMIT_MODIFIER:
		result = LimitModifier::Deserialize(deserializer);
		break;
	case ResultModifierType::LIMIT_PERCENT_MODIFIER:
		result = LimitPercentModifier::Deserialize(deserializer);
		break;
	case ResultModifierType::ORDER_MODIFIER:
		result = OrderModifier::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of ResultModifier!");
	}
	return result;
}